

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::IntermediateNode::output
          (IntermediateNode *this,ostream *out,bool multiline,int indent)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  Node *self;
  uint in_ECX;
  byte in_DL;
  ostream *in_RSI;
  Node *in_RDI;
  anon_class_24_3_1723b358 outp;
  bool brackets;
  Elem first;
  IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
  childIter;
  Node *in_stack_ffffffffffffff38;
  anon_class_24_3_1723b358 *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff5c;
  uint indent_00;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *in_stack_ffffffffffffff68;
  ostream local_28 [16];
  uint local_18;
  byte local_11;
  ostream *local_10;
  
  local_11 = in_DL & 1;
  poVar2 = local_28;
  local_18 = in_ECX;
  local_10 = in_RSI;
  (*in_RDI->_vptr_Node[8])();
  Lib::
  iterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node**>>
            (in_stack_ffffffffffffff68);
  Lib::
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>::
  ~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                    *)in_stack_ffffffffffffff40);
  SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node::term(in_RDI);
  bVar1 = Kernel::TermList::isEmpty((TermList *)0x497ccf);
  if (!bVar1) {
    SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node::term(in_RDI);
    poVar2 = Kernel::operator<<(poVar2,(TermList *)in_RDI);
    std::operator<<(poVar2," ; ");
  }
  poVar2 = std::operator<<(local_10,"S");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)&in_RDI[1]._vptr_Node);
  std::operator<<(poVar2," -> ");
  poVar3 = (ostream *)
           Lib::
           IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
           ::next((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                   *)in_stack_ffffffffffffff40);
  poVar2 = poVar3;
  bVar1 = Lib::
          IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
          ::hasNext((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                     *)0x497de4);
  indent_00 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
  if (bVar1) {
    if ((local_11 & 1) == 0) {
      std::operator<<(local_10,"[ ");
      Indexing::operator<<((ostream *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      while (bVar1 = Lib::
                     IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                     ::hasNext((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                                *)0x497f32), bVar1) {
        poVar2 = std::operator<<(local_10," | ");
        self = (Node *)Lib::
                       IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                       ::next((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                               *)poVar2);
        Indexing::operator<<(poVar2,self);
      }
      std::operator<<(local_10," ]");
    }
    else {
      std::operator<<(local_10,"[");
      output::anon_class_24_3_1723b358::operator()
                (in_stack_ffffffffffffff40,(Node **)in_stack_ffffffffffffff38);
      while( true ) {
        bVar1 = Lib::
                IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                ::hasNext((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                           *)0x497e73);
        indent_00 = CONCAT13((char)(indent_00 >> 0x18),CONCAT12(bVar1,(short)indent_00));
        if (!bVar1) break;
        Lib::
        IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
        ::next((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                *)in_stack_ffffffffffffff40);
        output::anon_class_24_3_1723b358::operator()
                  (in_stack_ffffffffffffff40,(Node **)in_stack_ffffffffffffff38);
      }
      std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
      Lib::Output::Multiline<int>::outputIndent(poVar2,indent_00);
      std::operator<<(local_10,"]");
    }
  }
  else {
    (*(*(Node **)poVar3)->_vptr_Node[7])
              (*(Node **)poVar3,local_10,(ulong)(local_11 & 1),(ulong)local_18);
  }
  Lib::
  IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
  ::~IterTraits((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
                 *)0x497fde);
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::IntermediateNode::output(std::ostream& out, bool multiline, int indent) const 
{
  // TODO const version of allChildren
  auto childIter = iterTraits(((IntermediateNode*)this)->allChildren());
  if (!this->term().isEmpty()) {
    out << this->term()
        << " ; ";
  }
  out << "S" << this->childVar << " -> ";

  auto first = childIter.next();
  auto brackets = childIter.hasNext();
  if (brackets) {


    if (multiline) {
      auto outp = [&](Node** x) { 
        out << std::endl; 
        Output::Multiline<int>::outputIndent(out, indent + 1);
        out << "| ";
        (*x)->output(out, multiline, indent + 1);
      };
      out << "[";
      outp(first);
      while (childIter.hasNext()) {
        outp(childIter.next());
      }
      out << std::endl; 
      Output::Multiline<int>::outputIndent(out, indent + 1);
      out << "]";

    } else {
      out << "[ ";
      out << **first;
      while (childIter.hasNext()) {
        out <<  " | " << **childIter.next();
      } 
      out << " ]";
    }


  } else {
    (*first)->output(out, multiline, indent);
  }

}